

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

void __thiscall hnsw::Matrix::Matrix(Matrix *this,float *data_ptr,size_t n_rows,size_t n_cols)

{
  undefined8 in_RCX;
  ulong in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t i;
  value_type *in_stack_ffffffffffffffa8;
  vector<const_float_*,_std::allocator<const_float_*>_> *this_00;
  ulong local_28;
  
  this_00 = (vector<const_float_*,_std::allocator<const_float_*>_> *)(in_RDI + 3);
  std::vector<const_float_*,_std::allocator<const_float_*>_>::vector
            ((vector<const_float_*,_std::allocator<const_float_*>_> *)0x115870);
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = in_RCX;
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    std::vector<const_float_*,_std::allocator<const_float_*>_>::push_back
              (this_00,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

explicit Matrix(const float *data_ptr, size_t n_rows, size_t n_cols) {
    data_ = data_ptr;
    rows_ = n_rows;
    cols_ = n_cols;
    for (size_t i = 0; i < n_rows; i++) {
      row_ptrs_.push_back(data_ + i * n_cols);
    }
  }